

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  byte bVar26;
  int iVar27;
  NodeRef *pNVar28;
  long lVar29;
  Scene *pSVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  NodeRef *pNVar37;
  size_t sVar38;
  ulong uVar39;
  float fVar40;
  uint uVar41;
  float fVar44;
  float fVar46;
  vint4 bi;
  uint uVar45;
  uint uVar47;
  float fVar48;
  uint uVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar50;
  float fVar60;
  float fVar64;
  vint4 ai;
  uint uVar51;
  uint uVar52;
  float fVar53;
  uint uVar61;
  uint uVar62;
  float fVar63;
  uint uVar65;
  uint uVar66;
  float fVar67;
  uint uVar68;
  uint uVar69;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar70;
  uint uVar73;
  uint uVar75;
  vint4 ai_1;
  float fVar74;
  float fVar76;
  uint uVar77;
  float fVar78;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined8 local_b38;
  undefined8 uStack_b30;
  NodeRef *local_b20;
  float fStack_b14;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  float fStack_ac4;
  undefined1 local_ab8 [16];
  long local_aa0;
  undefined8 local_a98;
  float fStack_a90;
  float fStack_a8c;
  undefined8 local_a88;
  float fStack_a80;
  float fStack_a7c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  float local_a68;
  undefined4 uStack_a64;
  undefined4 uStack_a60;
  undefined4 uStack_a5c;
  undefined1 (*local_a50) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_998;
  undefined8 uStack_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined1 local_958 [8];
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  float local_8e8 [4];
  float local_8d8 [4];
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  float local_8b8 [4];
  undefined1 local_8a8 [16];
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined4 local_888;
  undefined4 uStack_884;
  undefined4 uStack_880;
  undefined4 uStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  uint local_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint local_828;
  uint uStack_824;
  uint uStack_820;
  uint uStack_81c;
  uint local_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar34 = local_a78 ^ 0x10;
  iVar10 = (tray->tnear).field_0.i[k];
  iVar11 = (tray->tfar).field_0.i[k];
  local_7f8 = mm_lookupmask_ps._0_8_;
  uStack_7f0 = mm_lookupmask_ps._8_8_;
  local_808 = mm_lookupmask_ps._240_16_;
  local_a50 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_b20 = stack + 1;
LAB_00701ec5:
  do {
    pNVar37 = local_b20;
    if (pNVar37 == stack) {
LAB_00702d73:
      return pNVar37 != stack;
    }
    pNVar28 = pNVar37 + -1;
    sVar38 = pNVar37[-1].ptr;
    local_b20 = pNVar28;
    while ((sVar38 & 8) == 0) {
      pfVar1 = (float *)(sVar38 + 0x20 + local_a78);
      fVar40 = (*pfVar1 - fVar4) * fVar7;
      fVar44 = (pfVar1[1] - fVar4) * fVar7;
      fVar46 = (pfVar1[2] - fVar4) * fVar7;
      fVar48 = (pfVar1[3] - fVar4) * fVar7;
      pfVar1 = (float *)(sVar38 + 0x20 + uVar33);
      fVar50 = (*pfVar1 - fVar5) * fVar8;
      fVar60 = (pfVar1[1] - fVar5) * fVar8;
      fVar64 = (pfVar1[2] - fVar5) * fVar8;
      fVar67 = (pfVar1[3] - fVar5) * fVar8;
      uVar51 = (uint)((int)fVar50 < (int)fVar40) * (int)fVar40 |
               (uint)((int)fVar50 >= (int)fVar40) * (int)fVar50;
      uVar61 = (uint)((int)fVar60 < (int)fVar44) * (int)fVar44 |
               (uint)((int)fVar60 >= (int)fVar44) * (int)fVar60;
      uVar65 = (uint)((int)fVar64 < (int)fVar46) * (int)fVar46 |
               (uint)((int)fVar64 >= (int)fVar46) * (int)fVar64;
      uVar68 = (uint)((int)fVar67 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar67 >= (int)fVar48) * (int)fVar67;
      pfVar1 = (float *)(sVar38 + 0x20 + uVar39);
      fVar40 = (*pfVar1 - fVar6) * fVar9;
      fVar44 = (pfVar1[1] - fVar6) * fVar9;
      fVar46 = (pfVar1[2] - fVar6) * fVar9;
      fVar48 = (pfVar1[3] - fVar6) * fVar9;
      uVar41 = (uint)((int)fVar40 < iVar10) * iVar10 | (uint)((int)fVar40 >= iVar10) * (int)fVar40;
      uVar45 = (uint)((int)fVar44 < iVar10) * iVar10 | (uint)((int)fVar44 >= iVar10) * (int)fVar44;
      uVar47 = (uint)((int)fVar46 < iVar10) * iVar10 | (uint)((int)fVar46 >= iVar10) * (int)fVar46;
      uVar49 = (uint)((int)fVar48 < iVar10) * iVar10 | (uint)((int)fVar48 >= iVar10) * (int)fVar48;
      pfVar1 = (float *)(sVar38 + 0x20 + uVar34);
      fVar40 = (*pfVar1 - fVar4) * fVar7;
      fVar44 = (pfVar1[1] - fVar4) * fVar7;
      fVar46 = (pfVar1[2] - fVar4) * fVar7;
      fVar48 = (pfVar1[3] - fVar4) * fVar7;
      pfVar1 = (float *)(sVar38 + 0x20 + (uVar33 ^ 0x10));
      fVar50 = (*pfVar1 - fVar5) * fVar8;
      fVar60 = (pfVar1[1] - fVar5) * fVar8;
      fVar64 = (pfVar1[2] - fVar5) * fVar8;
      fVar67 = (pfVar1[3] - fVar5) * fVar8;
      uVar70 = (uint)((int)fVar40 < (int)fVar50) * (int)fVar40 |
               (uint)((int)fVar40 >= (int)fVar50) * (int)fVar50;
      uVar73 = (uint)((int)fVar44 < (int)fVar60) * (int)fVar44 |
               (uint)((int)fVar44 >= (int)fVar60) * (int)fVar60;
      uVar75 = (uint)((int)fVar46 < (int)fVar64) * (int)fVar46 |
               (uint)((int)fVar46 >= (int)fVar64) * (int)fVar64;
      uVar77 = (uint)((int)fVar48 < (int)fVar67) * (int)fVar48 |
               (uint)((int)fVar48 >= (int)fVar67) * (int)fVar67;
      pfVar1 = (float *)(sVar38 + 0x20 + (uVar39 ^ 0x10));
      fVar40 = (*pfVar1 - fVar6) * fVar9;
      fVar44 = (pfVar1[1] - fVar6) * fVar9;
      fVar46 = (pfVar1[2] - fVar6) * fVar9;
      fVar48 = (pfVar1[3] - fVar6) * fVar9;
      uVar52 = (uint)(iVar11 < (int)fVar40) * iVar11 | (uint)(iVar11 >= (int)fVar40) * (int)fVar40;
      uVar62 = (uint)(iVar11 < (int)fVar44) * iVar11 | (uint)(iVar11 >= (int)fVar44) * (int)fVar44;
      uVar66 = (uint)(iVar11 < (int)fVar46) * iVar11 | (uint)(iVar11 >= (int)fVar46) * (int)fVar46;
      uVar69 = (uint)(iVar11 < (int)fVar48) * iVar11 | (uint)(iVar11 >= (int)fVar48) * (int)fVar48;
      auVar57._0_4_ =
           -(uint)((int)(((int)uVar70 < (int)uVar52) * uVar70 |
                        ((int)uVar70 >= (int)uVar52) * uVar52) <
                  (int)(((int)uVar41 < (int)uVar51) * uVar51 | ((int)uVar41 >= (int)uVar51) * uVar41
                       ));
      auVar57._4_4_ =
           -(uint)((int)(((int)uVar73 < (int)uVar62) * uVar73 |
                        ((int)uVar73 >= (int)uVar62) * uVar62) <
                  (int)(((int)uVar45 < (int)uVar61) * uVar61 | ((int)uVar45 >= (int)uVar61) * uVar45
                       ));
      auVar57._8_4_ =
           -(uint)((int)(((int)uVar75 < (int)uVar66) * uVar75 |
                        ((int)uVar75 >= (int)uVar66) * uVar66) <
                  (int)(((int)uVar47 < (int)uVar65) * uVar65 | ((int)uVar47 >= (int)uVar65) * uVar47
                       ));
      auVar57._12_4_ =
           -(uint)((int)(((int)uVar77 < (int)uVar69) * uVar77 |
                        ((int)uVar77 >= (int)uVar69) * uVar69) <
                  (int)(((int)uVar49 < (int)uVar68) * uVar68 | ((int)uVar49 >= (int)uVar68) * uVar49
                       ));
      iVar27 = movmskps((int)pNVar28,auVar57);
      if (iVar27 == 0xf) goto LAB_00701ec5;
      bVar26 = (byte)iVar27 ^ 0xf;
      pNVar28 = (NodeRef *)(sVar38 & 0xfffffffffffffff0);
      lVar36 = 0;
      if (bVar26 != 0) {
        for (; (bVar26 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
        }
      }
      sVar38 = pNVar28[lVar36].ptr;
      uVar41 = bVar26 - 1 & (uint)bVar26;
      uVar35 = (ulong)uVar41;
      if (uVar41 != 0) {
        do {
          local_b20->ptr = sVar38;
          local_b20 = local_b20 + 1;
          lVar36 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
            }
          }
          sVar38 = pNVar28[lVar36].ptr;
          uVar35 = uVar35 - 1 & uVar35;
        } while (uVar35 != 0);
      }
    }
    uVar35 = sVar38 & 0xfffffffffffffff0;
    lVar36 = 0;
    local_a88 = (ulong)((uint)sVar38 & 0xf) - 8;
    while (lVar36 != local_a88) {
      lVar29 = lVar36 * 0xe0;
      puVar2 = (undefined8 *)(uVar35 + 0xd0 + lVar29);
      local_998 = *puVar2;
      uStack_990 = puVar2[1];
      pfVar1 = (float *)(uVar35 + lVar29);
      fVar48 = *pfVar1;
      fVar50 = pfVar1[1];
      fVar60 = pfVar1[2];
      fVar64 = pfVar1[3];
      pfVar1 = (float *)(uVar35 + 0x10 + lVar29);
      fVar67 = *pfVar1;
      fVar74 = pfVar1[1];
      fVar76 = pfVar1[2];
      fVar78 = pfVar1[3];
      pfVar1 = (float *)(uVar35 + 0x20 + lVar29);
      fVar117 = *pfVar1;
      fVar118 = pfVar1[1];
      fVar119 = pfVar1[2];
      fVar120 = pfVar1[3];
      pfVar1 = (float *)(uVar35 + 0x40 + lVar29);
      local_af8 = *(undefined8 *)pfVar1;
      uStack_af0 = *(undefined8 *)(pfVar1 + 2);
      fVar104 = fVar67 - *pfVar1;
      fVar105 = fVar74 - pfVar1[1];
      fVar106 = fVar76 - pfVar1[2];
      fVar107 = fVar78 - pfVar1[3];
      pfVar1 = (float *)(uVar35 + 0x50 + lVar29);
      local_b08 = *(undefined8 *)pfVar1;
      uStack_b00 = *(undefined8 *)(pfVar1 + 2);
      fVar90 = fVar117 - *pfVar1;
      fVar94 = fVar118 - pfVar1[1];
      fVar96 = fVar119 - pfVar1[2];
      fVar98 = fVar120 - pfVar1[3];
      pfVar1 = (float *)(uVar35 + 0x90 + lVar29);
      local_ad8 = *(undefined8 *)pfVar1;
      uStack_ad0 = *(undefined8 *)(pfVar1 + 2);
      fVar108 = *pfVar1 - fVar48;
      fVar110 = pfVar1[1] - fVar50;
      fVar111 = pfVar1[2] - fVar60;
      fVar112 = pfVar1[3] - fVar64;
      pfVar1 = (float *)(uVar35 + 0xa0 + lVar29);
      local_ae8 = *(undefined8 *)pfVar1;
      uStack_ae0 = *(undefined8 *)(pfVar1 + 2);
      fVar82 = *pfVar1 - fVar67;
      fVar83 = pfVar1[1] - fVar74;
      fVar84 = pfVar1[2] - fVar76;
      fVar85 = pfVar1[3] - fVar78;
      pfVar3 = (float *)(uVar35 + 0xb0 + lVar29);
      uStack_a70 = *(undefined8 *)(pfVar3 + 2);
      fVar86 = *pfVar3 - fVar117;
      fVar87 = pfVar3[1] - fVar118;
      fVar88 = pfVar3[2] - fVar119;
      fVar89 = pfVar3[3] - fVar120;
      local_948 = fVar90 * fVar82 - fVar104 * fVar86;
      fStack_944 = fVar94 * fVar83 - fVar105 * fVar87;
      fStack_940 = fVar96 * fVar84 - fVar106 * fVar88;
      fStack_93c = fVar98 * fVar85 - fVar107 * fVar89;
      fStack_b14 = *(float *)(ray + k * 4);
      fStack_ac4 = *(float *)(ray + k * 4 + 0x10);
      fVar40 = *(float *)(ray + k * 4 + 0x40);
      fVar44 = *(float *)(ray + k * 4 + 0x50);
      local_7e8 = fVar48 - fStack_b14;
      fStack_7e4 = fVar50 - fStack_b14;
      fStack_7e0 = fVar60 - fStack_b14;
      fStack_7dc = fVar64 - fStack_b14;
      fVar67 = fVar67 - fStack_ac4;
      fVar74 = fVar74 - fStack_ac4;
      fVar76 = fVar76 - fStack_ac4;
      fVar78 = fVar78 - fStack_ac4;
      fVar121 = local_7e8 * fVar44 - fVar67 * fVar40;
      fVar122 = fStack_7e4 * fVar44 - fVar74 * fVar40;
      fVar123 = fStack_7e0 * fVar44 - fVar76 * fVar40;
      fVar124 = fStack_7dc * fVar44 - fVar78 * fVar40;
      pfVar1 = (float *)(uVar35 + 0x30 + lVar29);
      local_b38 = *(undefined8 *)pfVar1;
      uStack_b30 = *(undefined8 *)(pfVar1 + 2);
      fVar48 = fVar48 - *pfVar1;
      fVar50 = fVar50 - pfVar1[1];
      fVar60 = fVar60 - pfVar1[2];
      fVar64 = fVar64 - pfVar1[3];
      fVar53 = fVar48 * fVar86 - fVar90 * fVar108;
      fVar63 = fVar50 * fVar87 - fVar94 * fVar110;
      fStack_a90 = fVar60 * fVar88 - fVar96 * fVar111;
      fStack_a8c = fVar64 * fVar89 - fVar98 * fVar112;
      fStack_a80 = *(float *)(ray + k * 4 + 0x20);
      fVar46 = *(float *)(ray + k * 4 + 0x60);
      fVar117 = fVar117 - fStack_a80;
      fVar118 = fVar118 - fStack_a80;
      fVar119 = fVar119 - fStack_a80;
      fVar120 = fVar120 - fStack_a80;
      fVar100 = fVar117 * fVar40 - local_7e8 * fVar46;
      fVar101 = fVar118 * fVar40 - fStack_7e4 * fVar46;
      fVar102 = fVar119 * fVar40 - fStack_7e0 * fVar46;
      fVar103 = fVar120 * fVar40 - fStack_7dc * fVar46;
      local_928 = fVar104 * fVar108 - fVar48 * fVar82;
      fStack_924 = fVar105 * fVar110 - fVar50 * fVar83;
      fStack_920 = fVar106 * fVar111 - fVar60 * fVar84;
      fStack_91c = fVar107 * fVar112 - fVar64 * fVar85;
      fVar91 = fVar67 * fVar46 - fVar117 * fVar44;
      fVar95 = fVar74 * fVar46 - fVar118 * fVar44;
      fVar97 = fVar76 * fVar46 - fVar119 * fVar44;
      fVar99 = fVar78 * fVar46 - fVar120 * fVar44;
      local_a98 = CONCAT44(fVar63,fVar53);
      fVar113 = local_948 * fVar40 + fVar53 * fVar44 + local_928 * fVar46;
      fVar114 = fStack_944 * fVar40 + fVar63 * fVar44 + fStack_924 * fVar46;
      fVar115 = fStack_940 * fVar40 + fStack_a90 * fVar44 + fStack_920 * fVar46;
      fVar116 = fStack_93c * fVar40 + fStack_a8c * fVar44 + fStack_91c * fVar46;
      uVar45 = (uint)fVar113 & 0x80000000;
      uVar47 = (uint)fVar114 & 0x80000000;
      uVar49 = (uint)fVar115 & 0x80000000;
      uVar51 = (uint)fVar116 & 0x80000000;
      local_988 = (float)((uint)(fVar108 * fVar91 + fVar82 * fVar100 + fVar86 * fVar121) ^ uVar45);
      fStack_984 = (float)((uint)(fVar110 * fVar95 + fVar83 * fVar101 + fVar87 * fVar122) ^ uVar47);
      fStack_980 = (float)((uint)(fVar111 * fVar97 + fVar84 * fVar102 + fVar88 * fVar123) ^ uVar49);
      fStack_97c = (float)((uint)(fVar112 * fVar99 + fVar85 * fVar103 + fVar89 * fVar124) ^ uVar51);
      local_978 = (float)((uint)(fVar91 * fVar48 + fVar100 * fVar104 + fVar121 * fVar90) ^ uVar45);
      fStack_974 = (float)((uint)(fVar95 * fVar50 + fVar101 * fVar105 + fVar122 * fVar94) ^ uVar47);
      fStack_970 = (float)((uint)(fVar97 * fVar60 + fVar102 * fVar106 + fVar123 * fVar96) ^ uVar49);
      fStack_96c = (float)((uint)(fVar99 * fVar64 + fVar103 * fVar107 + fVar124 * fVar98) ^ uVar51);
      local_958._0_4_ = ABS(fVar113);
      local_958._4_4_ = ABS(fVar114);
      fStack_950 = ABS(fVar115);
      fStack_94c = ABS(fVar116);
      bVar23 = ((0.0 <= local_978 && 0.0 <= local_988) && fVar113 != 0.0) &&
               local_988 + local_978 <= (float)local_958._0_4_;
      bVar24 = ((0.0 <= fStack_974 && 0.0 <= fStack_984) && fVar114 != 0.0) &&
               fStack_984 + fStack_974 <= (float)local_958._4_4_;
      bVar22 = ((0.0 <= fStack_970 && 0.0 <= fStack_980) && fVar115 != 0.0) &&
               fStack_980 + fStack_970 <= fStack_950;
      bVar21 = ((0.0 <= fStack_96c && 0.0 <= fStack_97c) && fVar116 != 0.0) &&
               fStack_97c + fStack_96c <= fStack_94c;
      local_aa0 = uVar35 + lVar29;
      auVar93._4_4_ = -(uint)bVar24;
      auVar93._0_4_ = -(uint)bVar23;
      auVar93._8_4_ = -(uint)bVar22;
      auVar93._12_4_ = -(uint)bVar21;
      uVar41 = movmskps((int)lVar29,auVar93);
      pSVar30 = (Scene *)(ulong)uVar41;
      lVar29 = local_a88;
      uVar31 = local_a78;
      uVar25 = *(undefined8 *)pfVar3;
      fVar48 = fStack_a80;
      if (uVar41 != 0) {
        local_968 = (float)(uVar45 ^ (uint)(local_7e8 * local_948 +
                                           fVar67 * fVar53 + fVar117 * local_928));
        fStack_964 = (float)(uVar47 ^ (uint)(fStack_7e4 * fStack_944 +
                                            fVar74 * fVar63 + fVar118 * fStack_924));
        fStack_960 = (float)(uVar49 ^ (uint)(fStack_7e0 * fStack_940 +
                                            fVar76 * fStack_a90 + fVar119 * fStack_920));
        fStack_95c = (float)(uVar51 ^ (uint)(fStack_7dc * fStack_93c +
                                            fVar78 * fStack_a8c + fVar120 * fStack_91c));
        fVar48 = *(float *)(ray + k * 4 + 0x30);
        local_a68 = *(float *)(ray + k * 4 + 0x80);
        uStack_a64 = 0;
        uStack_a60 = 0;
        uStack_a5c = 0;
        local_918._0_4_ =
             -(uint)((fVar48 * (float)local_958._0_4_ < local_968 &&
                     local_968 <= local_a68 * (float)local_958._0_4_) && bVar23);
        local_918._4_4_ =
             -(uint)((fVar48 * (float)local_958._4_4_ < fStack_964 &&
                     fStack_964 <= local_a68 * (float)local_958._4_4_) && bVar24);
        local_918._8_4_ =
             -(uint)((fVar48 * fStack_950 < fStack_960 && fStack_960 <= local_a68 * fStack_950) &&
                    bVar22);
        local_918._12_4_ =
             -(uint)((fVar48 * fStack_94c < fStack_95c && fStack_95c <= local_a68 * fStack_94c) &&
                    bVar21);
        uVar41 = movmskps(uVar41,local_918);
        pSVar30 = (Scene *)(ulong)uVar41;
        fVar48 = fStack_a80;
        if (uVar41 != 0) {
          local_938 = local_a98;
          uStack_930 = CONCAT44(fStack_a8c,fStack_a90);
          local_8a8._8_8_ = uStack_7f0;
          local_8a8._0_8_ = local_7f8;
          pSVar30 = context->scene;
          auVar20._4_4_ = local_958._4_4_;
          auVar20._0_4_ = local_958._0_4_;
          auVar20._8_4_ = fStack_950;
          auVar20._12_4_ = fStack_94c;
          auVar57 = rcpps(local_918,auVar20);
          fVar40 = auVar57._0_4_;
          fVar44 = auVar57._4_4_;
          fVar48 = auVar57._8_4_;
          fVar50 = auVar57._12_4_;
          fVar60 = (float)DAT_01f46a60;
          fVar64 = DAT_01f46a60._4_4_;
          fVar67 = DAT_01f46a60._12_4_;
          fVar46 = DAT_01f46a60._8_4_;
          fVar40 = (fVar60 - (float)local_958._0_4_ * fVar40) * fVar40 + fVar40;
          fVar44 = (fVar64 - (float)local_958._4_4_ * fVar44) * fVar44 + fVar44;
          fVar48 = (fVar46 - fStack_950 * fVar48) * fVar48 + fVar48;
          fVar50 = (fVar67 - fStack_94c * fVar50) * fVar50 + fVar50;
          local_8e8[0] = local_968 * fVar40;
          local_8e8[1] = fStack_964 * fVar44;
          local_8e8[2] = fStack_960 * fVar48;
          local_8e8[3] = fStack_95c * fVar50;
          auVar109._0_4_ = local_988 * fVar40;
          auVar109._4_4_ = fStack_984 * fVar44;
          auVar109._8_4_ = fStack_980 * fVar48;
          auVar109._12_4_ = fStack_97c * fVar50;
          auVar93 = minps(auVar109,_DAT_01f46a60);
          auVar54._0_4_ = fVar40 * local_978;
          auVar54._4_4_ = fVar44 * fStack_974;
          auVar54._8_4_ = fVar48 * fStack_970;
          auVar54._12_4_ = fVar50 * fStack_96c;
          auVar57 = minps(auVar54,_DAT_01f46a60);
          auVar71._0_4_ = fVar60 - auVar93._0_4_;
          auVar71._4_4_ = fVar64 - auVar93._4_4_;
          auVar71._8_4_ = fVar46 - auVar93._8_4_;
          auVar71._12_4_ = fVar67 - auVar93._12_4_;
          auVar80._0_4_ = fVar60 - auVar57._0_4_;
          auVar80._4_4_ = fVar64 - auVar57._4_4_;
          auVar80._8_4_ = fVar46 - auVar57._8_4_;
          auVar80._12_4_ = fVar67 - auVar57._12_4_;
          local_908 = blendvps(auVar93,auVar71,local_8a8);
          local_8f8 = blendvps(auVar57,auVar80,local_8a8);
          local_8d8[0] = local_948;
          local_8d8[1] = fStack_944;
          local_8d8[2] = fStack_940;
          local_8d8[3] = fStack_93c;
          local_8c8 = local_a98;
          uStack_8c0 = CONCAT44(fStack_a8c,fStack_a90);
          local_8b8[0] = local_928;
          local_8b8[1] = fStack_924;
          local_8b8[2] = fStack_920;
          local_8b8[3] = fStack_91c;
          uVar31 = (ulong)(byte)uVar41;
          local_a98 = lVar36;
          fStack_a7c = fStack_a80;
          do {
            uVar32 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
              }
            }
            local_838 = *(uint *)(local_aa0 + 0xc0 + uVar32 * 4);
            pGVar13 = (pSVar30->geometries).items[local_838].ptr;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00702d67;
              local_868 = *(undefined4 *)(local_908 + uVar32 * 4);
              fVar40 = local_8e8[uVar32 - 4];
              *(float *)(ray + k * 4 + 0x80) = local_8e8[uVar32];
              args.context = context->user;
              uVar12 = *(undefined4 *)((long)&local_998 + uVar32 * 4);
              local_848._4_4_ = uVar12;
              local_848._0_4_ = uVar12;
              local_848._8_4_ = uVar12;
              local_848._12_4_ = uVar12;
              local_858._4_4_ = fVar40;
              local_858._0_4_ = fVar40;
              local_858._8_4_ = fVar40;
              local_858._12_4_ = fVar40;
              local_898 = local_8d8[uVar32];
              local_888 = *(undefined4 *)((long)&local_8c8 + uVar32 * 4);
              local_878 = local_8b8[uVar32];
              fStack_894 = local_898;
              fStack_890 = local_898;
              fStack_88c = local_898;
              uStack_884 = local_888;
              uStack_880 = local_888;
              uStack_87c = local_888;
              fStack_874 = local_878;
              fStack_870 = local_878;
              fStack_86c = local_878;
              uStack_864 = local_868;
              uStack_860 = local_868;
              uStack_85c = local_868;
              uStack_834 = local_838;
              uStack_830 = local_838;
              uStack_82c = local_838;
              local_828 = (args.context)->instID[0];
              uStack_824 = local_828;
              uStack_820 = local_828;
              uStack_81c = local_828;
              local_818 = (args.context)->instPrimID[0];
              uStack_814 = local_818;
              uStack_810 = local_818;
              uStack_80c = local_818;
              local_ab8 = *local_a50;
              args.valid = (int *)local_ab8;
              args.geometryUserPtr = pGVar13->userPtr;
              args.hit = (RTCHitN *)&local_898;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar13->occlusionFilterN)(&args);
              }
              if (local_ab8 == (undefined1  [16])0x0) {
                auVar55._8_4_ = 0xffffffff;
                auVar55._0_8_ = 0xffffffffffffffff;
                auVar55._12_4_ = 0xffffffff;
                auVar55 = auVar55 ^ _DAT_01f46b70;
              }
              else {
                p_Var14 = context->args->filter;
                if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var14)(&args);
                }
                auVar42._0_4_ = -(uint)(local_ab8._0_4_ == 0);
                auVar42._4_4_ = -(uint)(local_ab8._4_4_ == 0);
                auVar42._8_4_ = -(uint)(local_ab8._8_4_ == 0);
                auVar42._12_4_ = -(uint)(local_ab8._12_4_ == 0);
                auVar55 = auVar42 ^ _DAT_01f46b70;
                auVar57 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar42);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
              }
              if ((_DAT_01f46b40 & auVar55) != (undefined1  [16])0x0) goto LAB_00702d67;
              *(float *)(ray + k * 4 + 0x80) = local_a68;
            }
            uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
          } while (uVar31 != 0);
          local_b38 = *(undefined8 *)(local_aa0 + 0x30);
          uStack_b30 = *(undefined8 *)(local_aa0 + 0x38);
          local_af8 = *(undefined8 *)(local_aa0 + 0x40);
          uStack_af0 = *(undefined8 *)(local_aa0 + 0x48);
          local_b08 = *(undefined8 *)(local_aa0 + 0x50);
          uStack_b00 = *(undefined8 *)(local_aa0 + 0x58);
          local_ad8 = *(undefined8 *)(local_aa0 + 0x90);
          uStack_ad0 = *(undefined8 *)(local_aa0 + 0x98);
          local_ae8 = *(undefined8 *)(local_aa0 + 0xa0);
          uStack_ae0 = *(undefined8 *)(local_aa0 + 0xa8);
          uStack_a70 = *(undefined8 *)(local_aa0 + 0xb8);
          fStack_b14 = *(float *)(ray + k * 4);
          fStack_ac4 = *(float *)(ray + k * 4 + 0x10);
          fVar40 = *(float *)(ray + k * 4 + 0x40);
          fVar44 = *(float *)(ray + k * 4 + 0x50);
          fVar46 = *(float *)(ray + k * 4 + 0x60);
          lVar29 = local_a88;
          lVar36 = local_a98;
          uVar31 = local_a78;
          uVar25 = *(undefined8 *)(local_aa0 + 0xb0);
          fVar48 = *(float *)(ray + k * 4 + 0x20);
        }
      }
      local_a88._4_4_ = fVar48;
      local_a78 = uVar25;
      local_a98 = lVar36;
      fVar48 = *(float *)(local_aa0 + 0x60);
      fVar50 = *(float *)(local_aa0 + 100);
      fVar60 = *(float *)(local_aa0 + 0x68);
      fVar64 = *(float *)(local_aa0 + 0x6c);
      fVar67 = *(float *)(local_aa0 + 0x70);
      fVar74 = *(float *)(local_aa0 + 0x74);
      fVar76 = *(float *)(local_aa0 + 0x78);
      fVar78 = *(float *)(local_aa0 + 0x7c);
      fVar117 = *(float *)(local_aa0 + 0x80);
      fVar118 = *(float *)(local_aa0 + 0x84);
      fVar119 = *(float *)(local_aa0 + 0x88);
      fVar120 = *(float *)(local_aa0 + 0x8c);
      local_ad8._0_4_ = fVar48 - (float)local_ad8;
      local_ad8._4_4_ = fVar50 - local_ad8._4_4_;
      uStack_ad0._0_4_ = fVar60 - (float)uStack_ad0;
      uStack_ad0._4_4_ = fVar64 - uStack_ad0._4_4_;
      local_ae8._0_4_ = fVar67 - (float)local_ae8;
      local_ae8._4_4_ = fVar74 - local_ae8._4_4_;
      uStack_ae0._0_4_ = fVar76 - (float)uStack_ae0;
      uStack_ae0._4_4_ = fVar78 - uStack_ae0._4_4_;
      local_a78._0_4_ = fVar117 - (float)local_a78;
      local_a78._4_4_ = fVar118 - local_a78._4_4_;
      fVar95 = fVar119 - (float)uStack_a70;
      fVar97 = fVar120 - uStack_a70._4_4_;
      local_b38._0_4_ = (float)local_b38 - fVar48;
      local_b38._4_4_ = local_b38._4_4_ - fVar50;
      uStack_b30._0_4_ = (float)uStack_b30 - fVar60;
      uStack_b30._4_4_ = uStack_b30._4_4_ - fVar64;
      local_af8._0_4_ = (float)local_af8 - fVar67;
      local_af8._4_4_ = local_af8._4_4_ - fVar74;
      uStack_af0._0_4_ = (float)uStack_af0 - fVar76;
      uStack_af0._4_4_ = uStack_af0._4_4_ - fVar78;
      local_b08._0_4_ = (float)local_b08 - fVar117;
      local_b08._4_4_ = local_b08._4_4_ - fVar118;
      uStack_b00._0_4_ = (float)uStack_b00 - fVar119;
      uStack_b00._4_4_ = uStack_b00._4_4_ - fVar120;
      fVar48 = fVar48 - fStack_b14;
      fVar50 = fVar50 - fStack_b14;
      fVar60 = fVar60 - fStack_b14;
      fVar64 = fVar64 - fStack_b14;
      fVar117 = fVar117 - local_a88._4_4_;
      fVar118 = fVar118 - local_a88._4_4_;
      fVar119 = fVar119 - local_a88._4_4_;
      fVar120 = fVar120 - local_a88._4_4_;
      fVar99 = fVar117 * fVar40 - fVar48 * fVar46;
      fVar100 = fVar118 * fVar40 - fVar50 * fVar46;
      fVar101 = fVar119 * fVar40 - fVar60 * fVar46;
      fVar102 = fVar120 * fVar40 - fVar64 * fVar46;
      local_948 = (float)local_a78 * (float)local_af8 - (float)local_ae8 * (float)local_b08;
      fStack_944 = local_a78._4_4_ * local_af8._4_4_ - local_ae8._4_4_ * local_b08._4_4_;
      fStack_940 = fVar95 * (float)uStack_af0 - (float)uStack_ae0 * (float)uStack_b00;
      fStack_93c = fVar97 * uStack_af0._4_4_ - uStack_ae0._4_4_ * uStack_b00._4_4_;
      fVar67 = fVar67 - fStack_ac4;
      fVar74 = fVar74 - fStack_ac4;
      fVar76 = fVar76 - fStack_ac4;
      fVar78 = fVar78 - fStack_ac4;
      fVar53 = fVar48 * fVar44 - fVar67 * fVar40;
      fVar63 = fVar50 * fVar44 - fVar74 * fVar40;
      fVar82 = fVar60 * fVar44 - fVar76 * fVar40;
      fVar83 = fVar64 * fVar44 - fVar78 * fVar40;
      fVar87 = (float)local_ad8 * (float)local_b08 - (float)local_a78 * (float)local_b38;
      fVar88 = local_ad8._4_4_ * local_b08._4_4_ - local_a78._4_4_ * local_b38._4_4_;
      fVar89 = (float)uStack_ad0 * (float)uStack_b00 - fVar95 * (float)uStack_b30;
      fVar90 = uStack_ad0._4_4_ * uStack_b00._4_4_ - fVar97 * uStack_b30._4_4_;
      local_928 = (float)local_ae8 * (float)local_b38 - (float)local_ad8 * (float)local_af8;
      fStack_924 = local_ae8._4_4_ * local_b38._4_4_ - local_ad8._4_4_ * local_af8._4_4_;
      fStack_920 = (float)uStack_ae0 * (float)uStack_b30 - (float)uStack_ad0 * (float)uStack_af0;
      fStack_91c = uStack_ae0._4_4_ * uStack_b30._4_4_ - uStack_ad0._4_4_ * uStack_af0._4_4_;
      fVar91 = fVar67 * fVar46 - fVar117 * fVar44;
      fVar94 = fVar74 * fVar46 - fVar118 * fVar44;
      fVar96 = fVar76 * fVar46 - fVar119 * fVar44;
      fVar98 = fVar78 * fVar46 - fVar120 * fVar44;
      fVar84 = fVar40 * local_948 + fVar44 * fVar87 + fVar46 * local_928;
      fVar85 = fVar40 * fStack_944 + fVar44 * fVar88 + fVar46 * fStack_924;
      fVar86 = fVar40 * fStack_940 + fVar44 * fVar89 + fVar46 * fStack_920;
      fVar46 = fVar40 * fStack_93c + fVar44 * fVar90 + fVar46 * fStack_91c;
      uVar41 = (uint)fVar84 & 0x80000000;
      uVar45 = (uint)fVar85 & 0x80000000;
      uVar47 = (uint)fVar86 & 0x80000000;
      uVar49 = (uint)fVar46 & 0x80000000;
      local_988 = (float)((uint)((float)local_b38 * fVar91 +
                                (float)local_af8 * fVar99 + (float)local_b08 * fVar53) ^ uVar41);
      fStack_984 = (float)((uint)(local_b38._4_4_ * fVar94 +
                                 local_af8._4_4_ * fVar100 + local_b08._4_4_ * fVar63) ^ uVar45);
      fStack_980 = (float)((uint)((float)uStack_b30 * fVar96 +
                                 (float)uStack_af0 * fVar101 + (float)uStack_b00 * fVar82) ^ uVar47)
      ;
      fStack_97c = (float)((uint)(uStack_b30._4_4_ * fVar98 +
                                 uStack_af0._4_4_ * fVar102 + uStack_b00._4_4_ * fVar83) ^ uVar49);
      local_978 = (float)((uint)(fVar91 * (float)local_ad8 +
                                fVar99 * (float)local_ae8 + fVar53 * (float)local_a78) ^ uVar41);
      fStack_974 = (float)((uint)(fVar94 * local_ad8._4_4_ +
                                 fVar100 * local_ae8._4_4_ + fVar63 * local_a78._4_4_) ^ uVar45);
      fStack_970 = (float)((uint)(fVar96 * (float)uStack_ad0 +
                                 fVar101 * (float)uStack_ae0 + fVar82 * fVar95) ^ uVar47);
      fStack_96c = (float)((uint)(fVar98 * uStack_ad0._4_4_ +
                                 fVar102 * uStack_ae0._4_4_ + fVar83 * fVar97) ^ uVar49);
      fVar40 = ABS(fVar84);
      fVar44 = ABS(fVar85);
      local_958 = (undefined1  [8])(CONCAT44(fVar85,fVar84) & 0x7fffffff7fffffff);
      fStack_950 = ABS(fVar86);
      fStack_94c = ABS(fVar46);
      bVar22 = ((0.0 <= local_978 && 0.0 <= local_988) && fVar84 != 0.0) &&
               local_988 + local_978 <= fVar40;
      auVar79._0_4_ = -(uint)bVar22;
      bVar24 = ((0.0 <= fStack_974 && 0.0 <= fStack_984) && fVar85 != 0.0) &&
               fStack_984 + fStack_974 <= fVar44;
      auVar79._4_4_ = -(uint)bVar24;
      bVar23 = ((0.0 <= fStack_970 && 0.0 <= fStack_980) && fVar86 != 0.0) &&
               fStack_980 + fStack_970 <= fStack_950;
      auVar79._8_4_ = -(uint)bVar23;
      bVar21 = ((0.0 <= fStack_96c && 0.0 <= fStack_97c) && fVar46 != 0.0) &&
               fStack_97c + fStack_96c <= fStack_94c;
      auVar79._12_4_ = -(uint)bVar21;
      iVar27 = movmskps((int)pSVar30,auVar79);
      if (iVar27 != 0) {
        local_968 = (float)(uVar41 ^ (uint)(fVar48 * local_948 +
                                           fVar67 * fVar87 + fVar117 * local_928));
        fStack_964 = (float)(uVar45 ^ (uint)(fVar50 * fStack_944 +
                                            fVar74 * fVar88 + fVar118 * fStack_924));
        fStack_960 = (float)(uVar47 ^ (uint)(fVar60 * fStack_940 +
                                            fVar76 * fVar89 + fVar119 * fStack_920));
        fStack_95c = (float)(uVar49 ^ (uint)(fVar64 * fStack_93c +
                                            fVar78 * fVar90 + fVar120 * fStack_91c));
        fVar46 = *(float *)(ray + k * 4 + 0x30);
        bVar15 = fVar46 * fVar40 < local_968;
        bVar16 = fVar46 * fVar44 < fStack_964;
        bVar17 = fVar46 * fStack_950 < fStack_960;
        bVar18 = fVar46 * fStack_94c < fStack_95c;
        auVar56._4_4_ = -(uint)bVar16;
        auVar56._0_4_ = -(uint)bVar15;
        auVar56._8_4_ = -(uint)bVar17;
        auVar56._12_4_ = -(uint)bVar18;
        local_a68 = *(float *)(ray + k * 4 + 0x80);
        uStack_a64 = 0;
        uStack_a60 = 0;
        uStack_a5c = 0;
        local_918._0_4_ = -(uint)((local_968 <= local_a68 * fVar40 && bVar15) && bVar22);
        local_918._4_4_ = -(uint)((fStack_964 <= local_a68 * fVar44 && bVar16) && bVar24);
        local_918._8_4_ = -(uint)((fStack_960 <= local_a68 * fStack_950 && bVar17) && bVar23);
        local_918._12_4_ = -(uint)((fStack_95c <= local_a68 * fStack_94c && bVar18) && bVar21);
        auVar19._4_4_ = local_918._4_4_;
        auVar19._0_4_ = local_918._0_4_;
        auVar19._8_4_ = local_918._8_4_;
        auVar19._12_4_ = local_918._12_4_;
        uVar41 = movmskps(iVar27,auVar19);
        if (uVar41 != 0) {
          local_938 = CONCAT44(fVar88,fVar87);
          uStack_930 = CONCAT44(fVar90,fVar89);
          local_8a8 = local_808;
          pSVar30 = context->scene;
          auVar57 = rcpps(auVar56,_local_958);
          fVar46 = auVar57._0_4_;
          fVar48 = auVar57._4_4_;
          fVar50 = auVar57._8_4_;
          fVar60 = auVar57._12_4_;
          fVar67 = (float)DAT_01f46a60;
          fVar74 = DAT_01f46a60._4_4_;
          fVar76 = DAT_01f46a60._12_4_;
          fVar64 = DAT_01f46a60._8_4_;
          fVar46 = (fVar67 - fVar40 * fVar46) * fVar46 + fVar46;
          fVar48 = (fVar74 - fVar44 * fVar48) * fVar48 + fVar48;
          fVar50 = (fVar64 - fStack_950 * fVar50) * fVar50 + fVar50;
          fVar60 = (fVar76 - fStack_94c * fVar60) * fVar60 + fVar60;
          local_8e8[0] = local_968 * fVar46;
          local_8e8[1] = fStack_964 * fVar48;
          local_8e8[2] = fStack_960 * fVar50;
          local_8e8[3] = fStack_95c * fVar60;
          auVar92._0_4_ = local_988 * fVar46;
          auVar92._4_4_ = fStack_984 * fVar48;
          auVar92._8_4_ = fStack_980 * fVar50;
          auVar92._12_4_ = fStack_97c * fVar60;
          auVar93 = minps(auVar92,_DAT_01f46a60);
          auVar81._0_4_ = fVar46 * local_978;
          auVar81._4_4_ = fVar48 * fStack_974;
          auVar81._8_4_ = fVar50 * fStack_970;
          auVar81._12_4_ = fVar60 * fStack_96c;
          auVar57 = minps(auVar81,_DAT_01f46a60);
          auVar58._0_4_ = fVar67 - auVar93._0_4_;
          auVar58._4_4_ = fVar74 - auVar93._4_4_;
          auVar58._8_4_ = fVar64 - auVar93._8_4_;
          auVar58._12_4_ = fVar76 - auVar93._12_4_;
          auVar72._0_4_ = fVar67 - auVar57._0_4_;
          auVar72._4_4_ = fVar74 - auVar57._4_4_;
          auVar72._8_4_ = fVar64 - auVar57._8_4_;
          auVar72._12_4_ = fVar76 - auVar57._12_4_;
          local_908 = blendvps(auVar93,auVar58,local_808);
          local_8f8 = blendvps(auVar57,auVar72,local_808);
          local_8d8[0] = local_948;
          local_8d8[1] = fStack_944;
          local_8d8[2] = fStack_940;
          local_8d8[3] = fStack_93c;
          local_8c8 = CONCAT44(fVar88,fVar87);
          uStack_8c0 = CONCAT44(fVar90,fVar89);
          local_8b8[0] = local_928;
          local_8b8[1] = fStack_924;
          local_8b8[2] = fStack_920;
          local_8b8[3] = fStack_91c;
          uVar32 = (ulong)(uVar41 & 0xff);
          local_a78 = uVar31;
          fStack_a80 = local_a88._4_4_;
          fStack_a7c = local_a88._4_4_;
          do {
            local_a88 = lVar29;
            uVar31 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            local_838 = *(uint *)(local_aa0 + 0xc0 + uVar31 * 4);
            pGVar13 = (pSVar30->geometries).items[local_838].ptr;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00702d67;
              local_868 = *(undefined4 *)(local_908 + uVar31 * 4);
              fVar40 = local_8e8[uVar31 - 4];
              *(float *)(ray + k * 4 + 0x80) = local_8e8[uVar31];
              args.context = context->user;
              uVar12 = *(undefined4 *)((long)&local_998 + uVar31 * 4);
              local_848._4_4_ = uVar12;
              local_848._0_4_ = uVar12;
              local_848._8_4_ = uVar12;
              local_848._12_4_ = uVar12;
              local_858._4_4_ = fVar40;
              local_858._0_4_ = fVar40;
              local_858._8_4_ = fVar40;
              local_858._12_4_ = fVar40;
              local_898 = local_8d8[uVar31];
              local_888 = *(undefined4 *)((long)&local_8c8 + uVar31 * 4);
              local_878 = local_8b8[uVar31];
              fStack_894 = local_898;
              fStack_890 = local_898;
              fStack_88c = local_898;
              uStack_884 = local_888;
              uStack_880 = local_888;
              uStack_87c = local_888;
              fStack_874 = local_878;
              fStack_870 = local_878;
              fStack_86c = local_878;
              uStack_864 = local_868;
              uStack_860 = local_868;
              uStack_85c = local_868;
              uStack_834 = local_838;
              uStack_830 = local_838;
              uStack_82c = local_838;
              local_828 = (args.context)->instID[0];
              uStack_824 = local_828;
              uStack_820 = local_828;
              uStack_81c = local_828;
              local_818 = (args.context)->instPrimID[0];
              uStack_814 = local_818;
              uStack_810 = local_818;
              uStack_80c = local_818;
              local_ab8 = *local_a50;
              args.valid = (int *)local_ab8;
              args.geometryUserPtr = pGVar13->userPtr;
              args.hit = (RTCHitN *)&local_898;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar13->occlusionFilterN)(&args);
              }
              if (local_ab8 == (undefined1  [16])0x0) {
                auVar59._8_4_ = 0xffffffff;
                auVar59._0_8_ = 0xffffffffffffffff;
                auVar59._12_4_ = 0xffffffff;
                auVar59 = auVar59 ^ _DAT_01f46b70;
              }
              else {
                p_Var14 = context->args->filter;
                if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var14)(&args);
                }
                auVar43._0_4_ = -(uint)(local_ab8._0_4_ == 0);
                auVar43._4_4_ = -(uint)(local_ab8._4_4_ == 0);
                auVar43._8_4_ = -(uint)(local_ab8._8_4_ == 0);
                auVar43._12_4_ = -(uint)(local_ab8._12_4_ == 0);
                auVar59 = auVar43 ^ _DAT_01f46b70;
                auVar57 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar43);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
              }
              if ((_DAT_01f46b40 & auVar59) != (undefined1  [16])0x0) goto LAB_00702d67;
              *(float *)(ray + k * 4 + 0x80) = local_a68;
            }
            uVar32 = uVar32 ^ 1L << (uVar31 & 0x3f);
            lVar29 = local_a88;
            uVar31 = local_a78;
          } while (uVar32 != 0);
        }
      }
      local_a88 = lVar29;
      local_a78 = uVar31;
      lVar36 = local_a98 + 1;
    }
  } while( true );
LAB_00702d67:
  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
  goto LAB_00702d73;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }